

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode hostname_check(Curl_URL *u,char *hostname)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  CURLUcode CVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  char *__s;
  char *pcVar9;
  bool bVar10;
  char zoneid [16];
  char local_38 [24];
  
  sVar6 = strlen(hostname);
  __s = hostname + (*hostname == '[');
  if (*hostname == '[') {
    sVar7 = strspn(__s,"0123456789abcdefABCDEF::.");
    if (sVar6 - 2 != sVar7) {
      if (__s[sVar7] != '%') {
        return CURLUE_MALFORMED_INPUT;
      }
      pcVar9 = __s + sVar7 + 1;
      iVar4 = strncmp(pcVar9,"25",2);
      if (((iVar4 == 0) && (__s[sVar7 + 3] != '\0')) && (__s[sVar7 + 3] != ']')) {
        pcVar9 = __s + sVar7 + 3;
      }
      cVar3 = *pcVar9;
      uVar8 = 0;
      if (cVar3 == '\0') {
        bVar10 = false;
      }
      else {
        do {
          if ((cVar3 == ']') || (0xe < uVar8)) goto LAB_004a4ace;
          uVar1 = uVar8 + 1;
          local_38[uVar8] = cVar3;
          cVar3 = pcVar9[uVar8 + 1];
          uVar8 = uVar1;
        } while (cVar3 != '\0');
        uVar8 = uVar1 & 0xffffffff;
LAB_004a4ace:
        bVar10 = cVar3 == ']';
      }
      bVar2 = false;
      pcVar9 = (char *)0x3;
      if (((int)uVar8 != 0) && (bVar10)) {
        local_38[uVar8 & 0xffffffff] = '\0';
        pcVar9 = (*Curl_cstrdup)(local_38);
        u->zoneid = pcVar9;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = (char *)0x7;
          bVar2 = false;
        }
        else {
          (__s + sVar7)[0] = ']';
          (__s + sVar7)[1] = '\0';
          bVar2 = true;
        }
      }
      if (!bVar2) {
        return (CURLUcode)pcVar9;
      }
    }
  }
  else {
    sVar7 = strcspn(__s," ");
    if (sVar6 != sVar7) {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  CVar5 = CURLUE_NO_HOST;
  if (*__s != '\0') {
    CVar5 = CURLUE_OK;
  }
  return CVar5;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname)
{
  const char *l = NULL; /* accepted characters */
  size_t len;
  size_t hlen = strlen(hostname);

  if(hostname[0] == '[') {
    hostname++;
    l = "0123456789abcdefABCDEF::.";
    hlen -= 2;
  }

  if(l) {
    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_MALFORMED_INPUT;
      /* hostname is fine */
    }
  }
  else {
    /* letters from the second string is not ok */
    len = strcspn(hostname, " ");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_MALFORMED_INPUT;
  }
  if(!hostname[0])
    return CURLUE_NO_HOST;
  return CURLUE_OK;
}